

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O3

void __thiscall QWidgetLineControl::parseInputMask(QWidgetLineControl *this,QString *maskFields)

{
  ushort uVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  void *pvVar5;
  long lVar6;
  char16_t cVar7;
  qsizetype n;
  void *pvVar8;
  long lVar9;
  bool bVar10;
  long lVar11;
  undefined1 uVar12;
  int iVar13;
  ulong uVar14;
  undefined4 uVar15;
  long lVar16;
  long lVar17;
  long in_FS_OFFSET;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.ptr = (maskFields->d).ptr;
  local_48.d.d = (Data *)(maskFields->d).size;
  n = QStringView::indexOf((QStringView *)&local_48,(QChar)0x3b,0,CaseSensitive);
  if ((n == 0) || ((maskFields->d).size == 0)) {
    pvVar8 = *(void **)(this + 0xe8);
    if (pvVar8 != (void *)0x0) {
      *(undefined8 *)(this + 0xe8) = 0;
      operator_delete__(pvVar8);
      *(undefined4 *)(this + 0x60) = 0x7fff;
      local_48.d.size = 0;
      local_48.d.d = (Data *)0x0;
      local_48.d.ptr = (char16_t *)0x0;
      internalSetText(this,&local_48,-1,false);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  else {
    if (n == -1) {
      *(undefined2 *)(this + 0xe0) = 0x20;
      QString::operator=((QString *)(this + 200),(QString *)maskFields);
    }
    else {
      QString::left(&local_48,maskFields,n);
      pQVar2 = *(QArrayData **)(this + 200);
      pcVar3 = *(char16_t **)(this + 0xd0);
      *(Data **)(this + 200) = local_48.d.d;
      *(char16_t **)(this + 0xd0) = local_48.d.ptr;
      qVar4 = *(qsizetype *)(this + 0xd8);
      *(qsizetype *)(this + 0xd8) = local_48.d.size;
      local_48.d.d = (Data *)pQVar2;
      local_48.d.ptr = pcVar3;
      local_48.d.size = qVar4;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
      cVar7 = L' ';
      if (n + 1 < (maskFields->d).size) {
        cVar7 = (maskFields->d).ptr[n + 1];
      }
      *(char16_t *)(this + 0xe0) = cVar7;
    }
    *(undefined4 *)(this + 0x60) = 0;
    lVar17 = *(long *)(this + 0xd8);
    if (lVar17 == 0) {
      pvVar8 = operator_new__(0);
    }
    else {
      lVar9 = 0;
      bVar10 = false;
      iVar13 = 0;
      do {
        if (bVar10) goto LAB_00425861;
        uVar1 = *(ushort *)(*(long *)(this + 0xd0) + lVar9 * 2);
        if (uVar1 < 0x5c) {
          if (uVar1 < 0x3e) {
            if ((uVar1 != 0x21) && (uVar1 != 0x3c)) {
LAB_00425861:
              iVar13 = iVar13 + 1;
              *(int *)(this + 0x60) = iVar13;
            }
          }
          else if ((uVar1 != 0x3e) && (uVar1 != 0x5b)) goto LAB_00425861;
LAB_00425866:
          bVar10 = false;
        }
        else {
          if (0x7a < uVar1) {
            if ((uVar1 != 0x7b) && (uVar1 != 0x7d)) goto LAB_00425861;
            goto LAB_00425866;
          }
          bVar10 = true;
          if (uVar1 != 0x5c) {
            if (uVar1 != 0x5d) goto LAB_00425861;
            goto LAB_00425866;
          }
        }
        lVar9 = lVar9 + 1;
      } while (lVar17 != lVar9);
      uVar14 = 0xffffffffffffffff;
      if (-1 < iVar13) {
        uVar14 = (long)iVar13 << 3;
      }
      pvVar8 = operator_new__(uVar14);
      if (iVar13 != 0) {
        memset(pvVar8,0,(long)iVar13 << 3);
      }
    }
    pvVar5 = *(void **)(this + 0xe8);
    *(void **)(this + 0xe8) = pvVar8;
    if (pvVar5 != (void *)0x0) {
      operator_delete__(pvVar5);
      lVar17 = *(long *)(this + 0xd8);
    }
    if (lVar17 != 0) {
      lVar9 = *(long *)(this + 0xd0);
      lVar6 = *(long *)(this + 0xe8);
      lVar11 = 0;
      iVar13 = 0;
      bVar10 = false;
      uVar15 = 0;
      do {
        uVar1 = *(ushort *)(lVar9 + lVar11 * 2);
        if (bVar10) {
          if (lVar6 != 0) {
            lVar16 = (long)iVar13;
            *(ushort *)(lVar6 + lVar16 * 8) = uVar1;
            *(undefined1 *)(lVar6 + 2 + lVar16 * 8) = 1;
            *(undefined4 *)(lVar6 + 4 + lVar16 * 8) = uVar15;
            iVar13 = iVar13 + 1;
            bVar10 = false;
            goto switchD_004259b8_caseD_5b;
          }
          parseInputMask();
          goto LAB_00425a4e;
        }
        uVar12 = 0;
        if (uVar1 < 0x5b) {
          uVar14 = (ulong)(uVar1 - 0x23);
          if (uVar1 - 0x23 < 0x36) {
            if ((0x200822c0402001U >> (uVar14 & 0x3f) & 1) != 0) goto switchD_004259b8_caseD_61;
            if (uVar14 == 0x19) {
              uVar15 = 2;
            }
            else {
              if (uVar14 != 0x1b) goto LAB_004259fc;
              uVar15 = 1;
            }
          }
          else {
LAB_004259fc:
            if (uVar1 != 0x21) goto switchD_004259b8_caseD_5e;
            uVar15 = 0;
          }
          goto switchD_004259b8_caseD_5b;
        }
        if (0x77 < uVar1) {
          if (uVar1 == 0x78) goto switchD_004259b8_caseD_61;
          if ((uVar1 != 0x7b) && (uVar1 != 0x7d)) goto switchD_004259b8_caseD_5e;
          goto switchD_004259b8_caseD_5b;
        }
        switch(uVar1) {
        case 0x5b:
        case 0x5d:
          break;
        case 0x5c:
          bVar10 = true;
          break;
        default:
switchD_004259b8_caseD_5e:
          uVar12 = 1;
        case 0x61:
        case 0x62:
        case 100:
        case 0x68:
        case 0x6e:
switchD_004259b8_caseD_61:
          if (lVar6 == 0) {
LAB_00425a4e:
            parseInputMask();
            goto LAB_00425a53;
          }
          lVar16 = (long)iVar13;
          *(ushort *)(lVar6 + lVar16 * 8) = uVar1;
          *(undefined1 *)(lVar6 + 2 + lVar16 * 8) = uVar12;
          *(undefined4 *)(lVar6 + 4 + lVar16 * 8) = uVar15;
          iVar13 = iVar13 + 1;
        }
switchD_004259b8_caseD_5b:
        lVar11 = lVar11 + 1;
      } while (lVar17 != lVar11);
    }
    internalSetText(this,(QString *)(this + 0x18),-1,false);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_00425a53:
  __stack_chk_fail();
}

Assistant:

void QWidgetLineControl::parseInputMask(const QString &maskFields)
{
    qsizetype delimiter = maskFields.indexOf(u';');
    if (maskFields.isEmpty() || delimiter == 0) {
        if (m_maskData) {
            m_maskData.reset();
            m_maxLength = 32767;
            internalSetText(QString(), -1, false);
        }
        return;
    }

    if (delimiter == -1) {
        m_blank = u' ';
        m_inputMask = maskFields;
    } else {
        m_inputMask = maskFields.left(delimiter);
        m_blank = (delimiter + 1 < maskFields.size()) ? maskFields[delimiter + 1] : u' ';
    }

    // calculate m_maxLength / m_maskData length
    m_maxLength = 0;
    bool escaped = false;
    for (int i=0; i<m_inputMask.size(); i++) {
        const auto c = m_inputMask.at(i);
        if (escaped) {
           ++m_maxLength;
           escaped = false;
           continue;
        }

        if (c == u'\\') {
           escaped = true;
           continue;
        }

        if (c != u'\\' && c != u'!' && c != u'<' && c != u'>' &&
             c != u'{' && c != u'}' && c != u'[' && c != u']')
            m_maxLength++;
    }

    m_maskData = std::make_unique<MaskInputData[]>(m_maxLength);

    MaskInputData::Casemode m = MaskInputData::NoCaseMode;
    bool s;
    bool escape = false;
    int index = 0;
    for (int i = 0; i < m_inputMask.size(); i++) {
        const auto c = m_inputMask.at(i);
        if (escape) {
            s = true;
            m_maskData[index].maskChar = c;
            m_maskData[index].separator = s;
            m_maskData[index].caseMode = m;
            index++;
            escape = false;
        } else if (c == u'<') {
            m = MaskInputData::Lower;
        } else if (c == u'>') {
            m = MaskInputData::Upper;
        } else if (c == u'!') {
            m = MaskInputData::NoCaseMode;
        } else if (c != u'{' && c != u'}' && c != u'[' && c != u']') {
            switch (c.unicode()) {
            case 'A':
            case 'a':
            case 'N':
            case 'n':
            case 'X':
            case 'x':
            case '9':
            case '0':
            case 'D':
            case 'd':
            case '#':
            case 'H':
            case 'h':
            case 'B':
            case 'b':
                s = false;
                break;
            case '\\':
                escape = true;
                Q_FALLTHROUGH();
            default:
                s = true;
                break;
            }

            if (!escape) {
                m_maskData[index].maskChar = c;
                m_maskData[index].separator = s;
                m_maskData[index].caseMode = m;
                index++;
            }
        }
    }
    internalSetText(m_text, -1, false);
}